

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.h
# Opt level: O0

void __thiscall bandit::failure_formatter::posix::~posix(posix *this)

{
  posix *this_local;
  
  ~posix(this);
  operator_delete(this,8);
  return;
}

Assistant:

std::string format(const detail::assertion_exception& err) const override {
        std::stringstream ss;
        if (err.file_name().size()) {
          ss << err.file_name();

          if (err.line_number()) {
            ss << ":" << err.line_number();
          }

          ss << ": ";
        }

        ss << err.what();

        return ss.str();
      }